

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double **ppdVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  double *pdVar11;
  ulong uVar12;
  int *piVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  int *piVar24;
  int k;
  ulong uVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  allocator_type local_b9;
  int *local_b8;
  ulong local_b0;
  double local_a8;
  uint local_9c;
  int *local_98;
  int *local_90;
  int *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  
  local_b8 = scaleBufferIndices;
  local_98 = bufferIndices;
  local_90 = categoryWeightsIndices;
  local_88 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&indexMaxScale,(long)this->kPatternCount,(allocator_type *)&maxScaleFactor);
  std::vector<double,_std::allocator<double>_>::vector
            (&maxScaleFactor,(long)this->kPatternCount,&local_b9);
  local_70 = (ulong)(count - 1);
  local_80 = (ulong)(uint)(~(count >> 0x1f) & count);
  piVar13 = local_98;
  piVar24 = local_b8;
  local_68 = (ulong)(uint)count;
  for (uVar19 = 0; uVar19 != local_80; uVar19 = uVar19 + 1) {
    local_78 = (long)piVar13[uVar19];
    uVar9 = this->kPatternCount;
    lVar21 = 0;
    pdVar11 = this->gPartials[local_78];
    pdVar4 = this->gStateFrequencies[local_88[uVar19]];
    pdVar5 = this->gCategoryWeights[local_90[uVar19]];
    uVar18 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
    uVar14 = ~((int)uVar9 >> 0x1f) & uVar9;
    iVar15 = 0;
    uVar20 = uVar18;
    for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
      lVar16 = (long)iVar15;
      pdVar6 = this->integrationTmp;
      iVar15 = iVar15 + uVar18;
      for (lVar10 = 0; (int)uVar20 - lVar16 != lVar10; lVar10 = lVar10 + 1) {
        pdVar6[(int)lVar21 + lVar10] = pdVar11[lVar16 + lVar10] * *pdVar5;
      }
      uVar20 = uVar20 + uVar18;
      lVar21 = (int)lVar21 + lVar10;
    }
    local_a8 = (double)(long)this->kCategoryCount;
    for (lVar21 = 1; lVar21 < (long)local_a8; lVar21 = lVar21 + 1) {
      iVar23 = 0;
      uVar18 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
      uVar20 = uVar18;
      for (uVar22 = 0; uVar22 != uVar14; uVar22 = uVar22 + 1) {
        lVar16 = (long)iVar23;
        pdVar6 = this->integrationTmp;
        for (lVar10 = 0; (int)uVar20 - lVar16 != lVar10; lVar10 = lVar10 + 1) {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = pdVar11[iVar15 + lVar10];
          auVar31._8_8_ = 0;
          auVar31._0_8_ = pdVar5[lVar21];
          auVar29._8_8_ = 0;
          auVar29._0_8_ = pdVar6[lVar16 + lVar10];
          auVar29 = vfmadd213sd_fma(auVar31,auVar27,auVar29);
          pdVar6[lVar16 + lVar10] = auVar29._0_8_;
        }
        iVar15 = iVar15 + (int)lVar10;
        uVar20 = uVar20 + uVar18;
        iVar23 = iVar23 + uVar18;
      }
      piVar13 = local_98;
    }
    lVar10 = 0;
    piVar24 = local_b8;
    local_b0 = uVar19;
    local_9c = uVar9;
    for (lVar21 = 0; lVar21 < (int)uVar9; lVar21 = lVar21 + 1) {
      auVar29 = ZEXT816(0) << 0x40;
      uVar25 = (ulong)(uint)(~(this->kStateCount >> 0x1f) & this->kStateCount);
      for (uVar12 = 0; dVar26 = auVar29._0_8_, uVar25 != uVar12; uVar12 = uVar12 + 1) {
        auVar28._8_8_ = 0;
        auVar28._0_8_ = pdVar4[uVar12];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = this->integrationTmp[(long)(int)lVar10 + uVar12];
        auVar29 = vfmadd231sd_fma(auVar29,auVar28,auVar2);
      }
      uVar9 = (uint)this->kFlags;
      if (*piVar24 == -1) {
        if ((uVar9 >> 8 & 1) != 0) goto LAB_00135374;
      }
      else {
        if ((uVar9 >> 8 & 1) == 0) {
          iVar15 = piVar24[uVar19];
          bVar8 = true;
        }
        else {
LAB_00135374:
          iVar15 = (int)local_78 - this->kTipCount;
          bVar8 = false;
        }
        ppdVar7 = this->gScaleBuffers;
        pdVar11 = ppdVar7[iVar15];
        if (uVar19 == 0) {
          indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21] = 0;
          uVar17 = 0;
          dVar1 = pdVar11[lVar21];
          auVar30 = ZEXT864((ulong)dVar1);
          maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21] = dVar1;
          for (uVar12 = 1; uVar19 = local_b0, local_68 != uVar12; uVar12 = uVar12 + 1) {
            if (bVar8) {
              iVar15 = piVar24[uVar12];
            }
            else {
              iVar15 = piVar13[uVar12] - this->kTipCount;
            }
            dVar1 = ppdVar7[iVar15][lVar21];
            if (auVar30._0_8_ < dVar1) {
              indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21] = (int)uVar12;
              maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21] = dVar1;
              auVar30 = ZEXT864((ulong)dVar1);
              uVar17 = uVar12 & 0xffffffff;
            }
          }
        }
        else {
          uVar17 = (ulong)(uint)indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar21];
        }
        if (uVar19 != uVar17) {
          local_a8 = dVar26;
          dVar26 = exp(pdVar11[lVar21] -
                       maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar21]);
          dVar26 = local_a8 * dVar26;
          uVar19 = local_b0;
          piVar24 = local_b8;
        }
      }
      pdVar11 = this->outLogLikelihoodsTmp;
      if (uVar19 == 0) {
        pdVar11[lVar21] = dVar26;
      }
      else {
        dVar26 = dVar26 + pdVar11[lVar21];
        if (uVar19 == local_70) {
          dVar26 = log(dVar26);
          pdVar11 = this->outLogLikelihoodsTmp;
          uVar19 = local_b0;
          piVar24 = local_b8;
        }
        pdVar11[lVar21] = dVar26;
      }
      uVar9 = this->kPatternCount;
      lVar10 = (long)(int)lVar10 + uVar25;
    }
  }
  if (*piVar24 == -1) {
    uVar9 = this->kPatternCount;
    if ((this->kFlags & 0x100) == 0) {
      uVar19 = (ulong)(~((int)uVar9 >> 0x1f) & uVar9);
      goto LAB_001354b2;
    }
  }
  else {
    uVar9 = this->kPatternCount;
  }
  pdVar11 = this->outLogLikelihoodsTmp;
  uVar19 = (ulong)(~((int)uVar9 >> 0x1f) & uVar9);
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    pdVar11[uVar12] =
         maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar12] + pdVar11[uVar12];
  }
LAB_001354b2:
  *outSumLogLikelihood = 0.0;
  auVar29 = ZEXT816(0) << 0x40;
  pdVar11 = this->gPatternWeights;
  pdVar4 = this->outLogLikelihoodsTmp;
  for (uVar12 = 0; uVar19 != uVar12; uVar12 = uVar12 + 1) {
    auVar32._8_8_ = 0;
    auVar32._0_8_ = pdVar4[uVar12];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pdVar11[uVar12];
    auVar29 = vfmadd231sd_fma(auVar29,auVar32,auVar3);
    *outSumLogLikelihood = auVar29._0_8_;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&maxScaleFactor.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indexMaxScale.super__Vector_base<int,_std::allocator<int>_>);
  return (uint)!NAN(auVar29._0_8_) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* scaleBufferIndices,
                                                         int count,
                                                         double* outSumLogLikelihood) {
    // Here we do the 3 similar operations:
    //              1. to set the lnL to the contribution of the first subset,
    //              2. to add the lnL for other subsets up to the penultimate
    //              3. to add the final subset and take the lnL
    //      This form of the calc would not work when count == 1 because
    //              we need operation 1 and 3 in the preceding list.  This is not
    //              a problem, though as we deal with count == 1 in the previous
    //              branch.

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            for (int k = 0; k < kPatternCount; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += ((REALTYPE)frequencies[i]) * integrationTmp[u];
                u++;
            }

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;

}